

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void get_token_pointers(TokenInfo *token_info,int tile_row,int tile_col,int sb_row_in_tile,
                       TokenExtra **tok,TokenExtra **tok_end)

{
  _Bool _Var1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  TokenInfo *in_RDI;
  long *in_R8;
  long *in_R9;
  
  _Var1 = is_token_info_allocated(in_RDI);
  if (_Var1) {
    *in_R8 = (long)in_RDI->tplist[in_ESI][in_EDX][in_ECX].start;
    *in_R9 = *in_R8 + (ulong)in_RDI->tplist[in_ESI][in_EDX][in_ECX].count;
  }
  else {
    *in_R8 = 0;
    *in_R9 = 0;
  }
  return;
}

Assistant:

static inline void get_token_pointers(const TokenInfo *token_info,
                                      const int tile_row, int tile_col,
                                      const int sb_row_in_tile,
                                      const TokenExtra **tok,
                                      const TokenExtra **tok_end) {
  if (!is_token_info_allocated(token_info)) {
    *tok = NULL;
    *tok_end = NULL;
    return;
  }
  *tok = token_info->tplist[tile_row][tile_col][sb_row_in_tile].start;
  *tok_end =
      *tok + token_info->tplist[tile_row][tile_col][sb_row_in_tile].count;
}